

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O0

int cpprofiler::sendall(int s,char *buf,int *len)

{
  int iVar1;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  ssize_t n;
  int bytesleft;
  int total;
  ssize_t local_28;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = *in_RDX;
  while ((local_1c < *in_RDX &&
         (local_28 = send(in_EDI,(void *)(in_RSI + local_1c),(long)local_20,0), local_28 != -1))) {
    local_1c = (int)local_28 + local_1c;
    local_20 = local_20 - (int)local_28;
  }
  *in_RDX = local_1c;
  iVar1 = 0;
  if (local_28 == -1) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int sendall(int s, const char* buf, int* len) {
  int total = 0;         // how many bytes we've sent
  int bytesleft = *len;  // how many we have left to send
  ssize_t n;

  while (total < *len) {
    n = send(s, buf + total, static_cast<size_t>(bytesleft), 0);
    if (n == -1) {
      break;
    }
    total += static_cast<int>(n);
    bytesleft -= static_cast<int>(n);
  }

  *len = total;  // return number actually sent here

  return n == -1 ? -1 : 0;  // return -1 on failure, 0 on success
}